

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::GLES2Context::~GLES2Context(GLES2Context *this)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__GLES2Context_003d5c10;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager>::release(&this->resourceManager);
  tcu::ThreadUtil::Object::~Object(&this->super_Object);
  return;
}

Assistant:

GLES2Context::~GLES2Context (void)
{
}